

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::~JunitReporter(JunitReporter *this)

{
  JunitReporter *this_local;
  
  ~JunitReporter(this);
  operator_delete(this,0x170);
  return;
}

Assistant:

JunitReporter::~JunitReporter() {}